

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&)> *work)

{
  undefined8 uVar1;
  _Hash_node_base *p_Var2;
  Runtime rt;
  Executor *local_48;
  Worker *local_40;
  Node *local_38;
  char local_30;
  
  if (((uint)node->_nstate >> 0x1d & 1) == 0) {
    local_30 = '\0';
    local_48 = this;
    local_40 = worker;
    local_38 = node;
    for (p_Var2 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var2[1]._M_nxt,worker,node);
    }
    if (*(long *)(work + 0x10) == 0) {
      uVar1 = std::__throw_bad_function_call();
      __cxa_begin_catch(uVar1);
      _process_exception(this,worker,node);
      __cxa_end_catch();
    }
    else {
      (**(code **)(work + 0x18))(work,&local_48);
    }
    for (p_Var2 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var2[1]._M_nxt,worker,node);
    }
    if (local_30 != '\0') {
      return true;
    }
  }
  else {
    node->_nstate = node->_nstate & 0xdfffffff;
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&)>& work
) {
  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    Runtime rt(*this, worker, node);

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }
  return false;
}